

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  CodedOutputStream *pCVar1;
  bool bVar2;
  LogMessage *other;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  long local_38;
  uint8 *end;
  uint8 *target;
  CodedOutputStream *pCStack_20;
  int size;
  CodedOutputStream *output_local;
  MessageLite *value_local;
  int field_number_local;
  
  pCStack_20 = output;
  output_local = (CodedOutputStream *)value;
  value_local._4_4_ = field_number;
  WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  target._4_4_ = (*(code *)output_local->output_[0xf]._vptr_ZeroCopyOutputStream)();
  io::CodedOutputStream::WriteVarint32(pCStack_20,target._4_4_);
  end = io::CodedOutputStream::GetDirectBufferForNBytesAndAdvance(pCStack_20,target._4_4_);
  pCVar1 = output_local;
  if (end == (uint8 *)0x0) {
    (*(code *)output_local->output_[0xd]._vptr_ZeroCopyOutputStream)(output_local,pCStack_20);
  }
  else {
    bVar2 = io::CodedOutputStream::IsSerializationDeterministic(pCStack_20);
    local_38 = (*(code *)pCVar1->output_[0x10]._vptr_ZeroCopyOutputStream)(pCVar1,bVar2,end);
    local_71 = 0;
    if (local_38 - (long)end != (long)(int)target._4_4_) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
                 ,0x247);
      local_71 = 1;
      other = LogMessage::operator<<(&local_70,"CHECK failed: (end - target) == (size): ");
      LogFinisher::operator=(local_85,other);
    }
    if ((local_71 & 1) != 0) {
      LogMessage::~LogMessage(&local_70);
    }
  }
  return;
}

Assistant:

void WireFormatLite::WriteMessageMaybeToArray(int field_number,
                                              const MessageLite& value,
                                              io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  const int size = value.GetCachedSize();
  output->WriteVarint32(size);
  uint8* target = output->GetDirectBufferForNBytesAndAdvance(size);
  if (target != NULL) {
    uint8* end = value.InternalSerializeWithCachedSizesToArray(
        output->IsSerializationDeterministic(), target);
    GOOGLE_DCHECK_EQ(end - target, size);
  } else {
    value.SerializeWithCachedSizes(output);
  }
}